

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScenePreprocessor.cpp
# Opt level: O0

void __thiscall
Assimp::ScenePreprocessor::ProcessAnimation(ScenePreprocessor *this,aiAnimation *anim)

{
  aiString *name;
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  aiNode *paVar4;
  aiQuatKey *paVar5;
  Logger *pLVar6;
  aiVectorKey *paVar7;
  aiVectorKey *local_108;
  aiVectorKey *local_e8;
  aiQuatKey *local_c8;
  double local_b8;
  undefined8 *local_b0;
  aiVectorKey *q_2;
  aiVectorKey *q_1;
  aiQuatKey *q;
  aiQuaternion rotation;
  aiVector3D position;
  aiVector3D scaling;
  aiNode *node;
  aiQuatKey *key_2;
  uint j_2;
  aiVectorKey *key_1;
  uint j_1;
  aiVectorKey *key;
  uint j;
  aiNodeAnim *channel;
  double dStack_28;
  uint i;
  double last;
  double first;
  aiAnimation *anim_local;
  ScenePreprocessor *this_local;
  
  last = 100000000000.0;
  dStack_28 = -100000000000.0;
  first = (double)anim;
  anim_local = (aiAnimation *)this;
  for (channel._4_4_ = 0; channel._4_4_ < *(uint *)((long)first + 0x418);
      channel._4_4_ = channel._4_4_ + 1) {
    name = *(aiString **)(*(long *)((long)first + 0x420) + (ulong)channel._4_4_ * 8);
    if ((*(double *)((long)first + 0x408) == -1.0) && (!NAN(*(double *)((long)first + 0x408)))) {
      for (key._4_4_ = 0; key._4_4_ < name[1].length; key._4_4_ = key._4_4_ + 1) {
        pdVar2 = (double *)(*(long *)name[1].data + (ulong)key._4_4_ * 0x18);
        pdVar3 = std::min<double>(&last,pdVar2);
        last = *pdVar3;
        pdVar2 = std::max<double>(&stack0xffffffffffffffd8,pdVar2);
        dStack_28 = *pdVar2;
      }
      for (key_1._4_4_ = 0; key_1._4_4_ < *(uint *)(name[1].data + 0x18);
          key_1._4_4_ = key_1._4_4_ + 1) {
        pdVar2 = (double *)(*(long *)(name[1].data + 0x20) + (ulong)key_1._4_4_ * 0x18);
        pdVar3 = std::min<double>(&last,pdVar2);
        last = *pdVar3;
        pdVar2 = std::max<double>(&stack0xffffffffffffffd8,pdVar2);
        dStack_28 = *pdVar2;
      }
      for (key_2._4_4_ = 0; key_2._4_4_ < *(uint *)(name[1].data + 8); key_2._4_4_ = key_2._4_4_ + 1
          ) {
        pdVar2 = (double *)(*(long *)(name[1].data + 0x10) + (ulong)key_2._4_4_ * 0x18);
        pdVar3 = std::min<double>(&last,pdVar2);
        last = *pdVar3;
        pdVar2 = std::max<double>(&stack0xffffffffffffffd8,pdVar2);
        dStack_28 = *pdVar2;
      }
    }
    if ((((*(int *)(name[1].data + 8) == 0) || (name[1].length == 0)) ||
        (*(int *)(name[1].data + 0x18) == 0)) &&
       (paVar4 = aiNode::FindNode(this->scene->mRootNode,name), paVar4 != (aiNode *)0x0)) {
      aiVector3t<float>::aiVector3t((aiVector3t<float> *)&position.y);
      aiVector3t<float>::aiVector3t((aiVector3t<float> *)&rotation.y);
      aiQuaterniont<float>::aiQuaterniont((aiQuaterniont<float> *)&q);
      aiMatrix4x4t<float>::Decompose
                (&paVar4->mTransformation,(aiVector3t<float> *)&position.y,
                 (aiQuaterniont<float> *)&q,(aiVector3t<float> *)&rotation.y);
      if (*(int *)(name[1].data + 8) == 0) {
        name[1].data[8] = '\x01';
        name[1].data[9] = '\0';
        name[1].data[10] = '\0';
        name[1].data[0xb] = '\0';
        paVar5 = (aiQuatKey *)operator_new__(0x18);
        local_c8 = paVar5;
        do {
          aiQuatKey::aiQuatKey(local_c8);
          local_c8 = local_c8 + 1;
        } while (local_c8 != paVar5 + 1);
        *(aiQuatKey **)(name[1].data + 0x10) = paVar5;
        q_1 = *(aiVectorKey **)(name[1].data + 0x10);
        q_1->mTime = 0.0;
        *(aiQuatKey **)&q_1->mValue = q;
        *(undefined8 *)&(q_1->mValue).z = rotation._0_8_;
        pLVar6 = DefaultLogger::get();
        Logger::debug(pLVar6,"ScenePreprocessor: Dummy rotation track has been generated");
      }
      if (*(int *)(name[1].data + 0x18) == 0) {
        name[1].data[0x18] = '\x01';
        name[1].data[0x19] = '\0';
        name[1].data[0x1a] = '\0';
        name[1].data[0x1b] = '\0';
        paVar7 = (aiVectorKey *)operator_new__(0x18);
        local_e8 = paVar7;
        do {
          aiVectorKey::aiVectorKey(local_e8);
          local_e8 = local_e8 + 1;
        } while (local_e8 != paVar7 + 1);
        *(aiVectorKey **)(name[1].data + 0x20) = paVar7;
        q_2 = *(aiVectorKey **)(name[1].data + 0x20);
        q_2->mTime = 0.0;
        (q_2->mValue).x = position.y;
        (q_2->mValue).y = position.z;
        (q_2->mValue).z = scaling.x;
        pLVar6 = DefaultLogger::get();
        Logger::debug(pLVar6,"ScenePreprocessor: Dummy scaling track has been generated");
      }
      if (name[1].length == 0) {
        name[1].length = 1;
        paVar7 = (aiVectorKey *)operator_new__(0x18);
        local_108 = paVar7;
        do {
          aiVectorKey::aiVectorKey(local_108);
          local_108 = local_108 + 1;
        } while (local_108 != paVar7 + 1);
        *(aiVectorKey **)name[1].data = paVar7;
        local_b0 = *(undefined8 **)name[1].data;
        *local_b0 = 0;
        local_b0[1] = rotation._8_8_;
        *(float *)(local_b0 + 2) = position.x;
        pLVar6 = DefaultLogger::get();
        Logger::debug(pLVar6,"ScenePreprocessor: Dummy position track has been generated");
      }
    }
  }
  if ((*(double *)((long)first + 0x408) == -1.0) && (!NAN(*(double *)((long)first + 0x408)))) {
    pLVar6 = DefaultLogger::get();
    Logger::debug(pLVar6,"ScenePreprocessor: Setting animation duration");
    dVar1 = dStack_28;
    local_b8 = 0.0;
    pdVar2 = std::min<double>(&last,&local_b8);
    *(double *)((long)first + 0x408) = dVar1 - *pdVar2;
  }
  return;
}

Assistant:

void ScenePreprocessor::ProcessAnimation (aiAnimation* anim)
{
    double first = 10e10, last = -10e10;
    for (unsigned int i = 0; i < anim->mNumChannels;++i)    {
        aiNodeAnim* channel = anim->mChannels[i];

        /*  If the exact duration of the animation is not given
         *  compute it now.
         */
        if (anim->mDuration == -1.) {

            // Position keys
            for (unsigned int j = 0; j < channel->mNumPositionKeys;++j) {
                aiVectorKey& key = channel->mPositionKeys[j];
                first = std::min (first, key.mTime);
                last  = std::max (last,  key.mTime);
            }

            // Scaling keys
            for (unsigned int j = 0; j < channel->mNumScalingKeys;++j )  {
                aiVectorKey& key = channel->mScalingKeys[j];
                first = std::min (first, key.mTime);
                last  = std::max (last,  key.mTime);
            }

            // Rotation keys
            for (unsigned int j = 0; j < channel->mNumRotationKeys;++j ) {
                aiQuatKey& key = channel->mRotationKeys[ j ];
                first = std::min (first, key.mTime);
                last  = std::max (last,  key.mTime);
            }
        }

        /*  Check whether the animation channel has no rotation
         *  or position tracks. In this case we generate a dummy
         *  track from the information we have in the transformation
         *  matrix of the corresponding node.
         */
        if (!channel->mNumRotationKeys || !channel->mNumPositionKeys || !channel->mNumScalingKeys)  {
            // Find the node that belongs to this animation
            aiNode* node = scene->mRootNode->FindNode(channel->mNodeName);
            if (node) // ValidateDS will complain later if 'node' is NULL
            {
                // Decompose the transformation matrix of the node
                aiVector3D scaling, position;
                aiQuaternion rotation;

                node->mTransformation.Decompose(scaling, rotation,position);

                // No rotation keys? Generate a dummy track
                if (!channel->mNumRotationKeys) {
                    channel->mNumRotationKeys = 1;
                    channel->mRotationKeys = new aiQuatKey[1];
                    aiQuatKey& q = channel->mRotationKeys[0];

                    q.mTime  = 0.;
                    q.mValue = rotation;

                    ASSIMP_LOG_DEBUG("ScenePreprocessor: Dummy rotation track has been generated");
                }

                // No scaling keys? Generate a dummy track
                if (!channel->mNumScalingKeys)  {
                    channel->mNumScalingKeys = 1;
                    channel->mScalingKeys = new aiVectorKey[1];
                    aiVectorKey& q = channel->mScalingKeys[0];

                    q.mTime  = 0.;
                    q.mValue = scaling;

                    ASSIMP_LOG_DEBUG("ScenePreprocessor: Dummy scaling track has been generated");
                }

                // No position keys? Generate a dummy track
                if (!channel->mNumPositionKeys) {
                    channel->mNumPositionKeys = 1;
                    channel->mPositionKeys = new aiVectorKey[1];
                    aiVectorKey& q = channel->mPositionKeys[0];

                    q.mTime  = 0.;
                    q.mValue = position;

                    ASSIMP_LOG_DEBUG("ScenePreprocessor: Dummy position track has been generated");
                }
            }
        }
    }

    if (anim->mDuration == -1.)     {
        ASSIMP_LOG_DEBUG("ScenePreprocessor: Setting animation duration");
        anim->mDuration = last - std::min( first, 0. );
    }
}